

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void crnlib::
     hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
     ::move_node(node *pDst,node *pSrc)

{
  node *pSrc_local;
  node *pDst_local;
  
  *(undefined8 *)(pDst->super_value_type).first.m_s =
       *(undefined8 *)(pSrc->super_value_type).first.m_s;
  *(undefined8 *)&(pDst->super_value_type).second = *(undefined8 *)&(pSrc->super_value_type).second;
  pSrc->state = '\0';
  return;
}

Assistant:

static inline void move_node(node* pDst, node* pSrc)
        {
            CRNLIB_ASSERT(!pDst->state);

            if (CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Key) && CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Value))
            {
                memcpy(pDst, pSrc, sizeof(node));
            }
            else
            {
                if (CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Key))
                {
                    memcpy(&pDst->first, &pSrc->first, sizeof(Key));
                }
                else
                {
                    scalar_type<Key>::construct(&pDst->first, pSrc->first);
                    scalar_type<Key>::destruct(&pSrc->first);
                }

                if (CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Value))
                {
                    memcpy(&pDst->second, &pSrc->second, sizeof(Value));
                }
                else
                {
                    scalar_type<Value>::construct(&pDst->second, pSrc->second);
                    scalar_type<Value>::destruct(&pSrc->second);
                }

                pDst->state = cStateValid;
            }

            pSrc->state = cStateInvalid;
        }